

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O3

float getDistance(Mat *v1,Mat *v2)

{
  float fVar1;
  Mat sub;
  _OutputArray local_1e8;
  Mat local_1d0 [96];
  undefined1 local_170 [16];
  Size local_160;
  Mat local_100 [96];
  Mat local_a0 [144];
  
  cv::operator-((Mat *)local_170,v1);
  cv::Mat::Mat(local_1d0);
  (**(code **)(*(long *)CONCAT44(local_170._4_4_,local_170._0_4_) + 0x18))
            ((long *)CONCAT44(local_170._4_4_,local_170._0_4_),(Mat *)local_170,local_1d0,0xffffffff
            );
  cv::Mat::~Mat(local_a0);
  cv::Mat::~Mat(local_100);
  cv::Mat::~Mat((Mat *)(local_170 + 0x10));
  local_160.width = 0;
  local_160.height = 0;
  local_170._0_4_ = 0x1010000;
  local_1e8.super__InputArray.sz.width = 0;
  local_1e8.super__InputArray.sz.height = 0;
  local_1e8.super__InputArray.flags = 0x2010000;
  local_1e8.super__InputArray.obj = local_1d0;
  local_170._8_8_ = local_1d0;
  cv::pow((_InputArray *)local_170,2.0,&local_1e8);
  local_1e8.super__InputArray.sz.width = 0;
  local_1e8.super__InputArray.sz.height = 0;
  local_1e8.super__InputArray.flags = 0x1010000;
  local_1e8.super__InputArray.obj = local_1d0;
  cv::sum((_InputArray *)local_170);
  fVar1 = (float)(double)CONCAT44(local_170._4_4_,local_170._0_4_);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  cv::Mat::~Mat(local_1d0);
  return fVar1;
}

Assistant:

float getDistance(Mat& v1, Mat& v2) {
	Mat sub = v1 - v2;
	pow(sub, 2.0, sub);
	double sum=cv::sum(sub)[0];
	return sqrtf(sum);
}